

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.c
# Opt level: O0

char * mpt_readline(char *prompt)

{
  ushort **ppuVar1;
  char *pcVar2;
  char *ret;
  char *prompt_local;
  
  if (mpt_readline::r.fcn == (_func_char_ptr_char_ptr *)0x0) {
    pcVar2 = getenv("MALLOC_TRACE");
    if (pcVar2 == (char *)0x0) {
      mpt_readline::r.fcn = (_func_char_ptr_char_ptr *)dlsym(lib_glob,"readline");
      if ((mpt_readline::r.fcn == (_func_char_ptr_char_ptr *)0x0) &&
         (mpt_readline::r.addr = open_backend(),
         mpt_readline::r.fcn == (_func_char_ptr_char_ptr *)0x0)) {
        mpt_readline::r.fcn = _readline;
        mpt_readline::h.fcn = (_func_char_ptr_char_ptr *)0x0;
      }
      else {
        mpt_readline::h.fcn = (_func_char_ptr_char_ptr *)dlsym(lib_glob,"add_history");
      }
      prompt_local = mpt_readline(prompt);
    }
    else {
      fputs("disabled readline support for memory tracing\n",_stderr);
      mpt_readline::h.fcn = (_func_char_ptr_char_ptr *)0x0;
      mpt_readline::r.fcn = _readline;
      prompt_local = _readline(prompt);
    }
  }
  else {
    prompt_local = (*mpt_readline::r.fcn)(prompt);
    if ((((mpt_readline::h.fcn != (_func_char_ptr_char_ptr *)0x0) && (prompt_local != (char *)0x0))
        && (*prompt_local != '\0')) &&
       (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*prompt_local] & 0x2000) == 0)) {
      (*mpt_readline::h.fcn)(prompt_local);
    }
  }
  return prompt_local;
}

Assistant:

extern char *mpt_readline(const char *prompt)
{
	static union {
		char *(*fcn)(const char *);
		void *addr;
	} r = { 0 }, h;
	
	/* backend already selected */
	if (r.fcn) {
		char *ret = r.fcn(prompt);
		if (h.fcn && ret && *ret && !isspace(*ret)) {
			h.fcn(ret);
		}
		return ret;
	}
	/* no 3rd party allocations */
	if (getenv("MALLOC_TRACE")) {
		fputs("disabled readline support for memory tracing\n", stderr);
		h.addr = 0;
		return (r.fcn = _readline)(prompt);
	}
	/* use linked implementation */
	r.addr = dlsym(lib_glob, "readline");
	
	/* alternate shared lib implementation */
	if (r.addr || (r.addr = open_backend())) {
		h.addr = dlsym(lib_glob, "add_history");
	}
	/* fallback implementation */
	else {
		r.fcn = _readline;
		h.addr = 0;
	}
	/* (re)call with defined backend */
	return mpt_readline(prompt);
}